

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

UChar * __thiscall icu_63::ZNStringPool::adopt(ZNStringPool *this,UChar *s,UErrorCode *status)

{
  void *pvVar1;
  UChar *ncs;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (s == (UChar *)0x0) {
      s = (UChar *)0x0;
    }
    else {
      pvVar1 = uhash_get_63(this->fHash,s);
      if (pvVar1 == (void *)0x0) {
        uhash_put_63(this->fHash,s,s,status);
      }
    }
  }
  else {
    s = L"";
  }
  return s;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }